

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O2

void __thiscall
gl4cts::StencilTexturing::FunctionalTest::draw
          (FunctionalTest *this,GLuint program_id,GLuint dst_texture_id,GLuint src_texture_id)

{
  uint in_EAX;
  int iVar1;
  deUint32 dVar2;
  undefined4 uVar3;
  undefined4 extraout_var;
  GLuint vao_id;
  GLuint fb_id;
  long lVar4;
  
  _vao_id = (ulong)in_EAX;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  _vao_id = _vao_id & 0xffffffff00000000;
  (**(code **)(lVar4 + 0xfd8))(0x8e72,1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"PatchParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2d6);
  (**(code **)(lVar4 + 0x708))(1,&vao_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"GenVertexArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2da);
  (**(code **)(lVar4 + 0xd8))(_vao_id & 0xffffffff);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"BindVertexArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2dd);
  (**(code **)(lVar4 + 0x6d0))(1,&fb_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"GenFramebuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2e1);
  (**(code **)(lVar4 + 0x78))(0x8ca9,fb_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"BindFramebuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2e4);
  (**(code **)(lVar4 + 0x690))(0x8ca9,0x8ce0,dst_texture_id,0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"FramebufferTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2e7);
  (**(code **)(lVar4 + 0x1a00))(0,0,8);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Viewport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2ea);
  (**(code **)(lVar4 + 0x1680))(program_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2ee);
  uVar3 = (**(code **)(lVar4 + 0xb48))(program_id,"uni_sampler");
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"GetUniformLocation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2f2);
  (**(code **)(lVar4 + 8))(0x84c1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"ActiveTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2f5);
  (**(code **)(lVar4 + 0xb8))(0xde1,src_texture_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2f8);
  (**(code **)(lVar4 + 0x14f0))(uVar3,1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Uniform1i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2fb);
  (**(code **)(lVar4 + 0x538))(0xe,0,1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x2ff);
  (**(code **)(lVar4 + 0xdb8))(0xffffffffffffffff);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"MemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x303);
  (**(code **)(lVar4 + 0xd8))(0);
  (**(code **)(lVar4 + 0x78))(0x8ca9,0);
  (**(code **)(lVar4 + 0xb8))(0xde1,0);
  if (vao_id != 0) {
    (**(code **)(lVar4 + 0x490))(1,&vao_id);
  }
  if (fb_id != 0) {
    (**(code **)(lVar4 + 0x440))(1,&fb_id);
  }
  return;
}

Assistant:

void FunctionalTest::draw(GLuint program_id, GLuint dst_texture_id, GLuint src_texture_id)
{
	GLuint			 fb_id			 = 0;
	const Functions& gl				 = m_context.getRenderContext().getFunctions();
	GLint			 uni_sampler_loc = -1;
	GLuint			 vao_id			 = 0;

	try
	{
		/* Tesselation patch set up */
		gl.patchParameteri(GL_PATCH_VERTICES, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "PatchParameteri");

		/* Prepare VAO */
		gl.genVertexArrays(1, &vao_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GenVertexArrays");

		gl.bindVertexArray(vao_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexArray");

		/* Prepare FBO */
		gl.genFramebuffers(1, &fb_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GenFramebuffers");

		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, fb_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindFramebuffer");

		gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, dst_texture_id, 0 /* level */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "FramebufferTexture");

		gl.viewport(0 /* x */, 0 /* y */, m_width, m_height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Viewport");

		/* Set program */
		gl.useProgram(program_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

		/* Get uniform location and bind texture to proper texture unit */
		uni_sampler_loc = gl.getUniformLocation(program_id, "uni_sampler");
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformLocation");

		gl.activeTexture(GL_TEXTURE0 + m_texture_unit);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ActiveTexture");

		gl.bindTexture(GL_TEXTURE_2D, src_texture_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.uniform1i(uni_sampler_loc, m_texture_unit);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

		/* Draw */
		gl.drawArrays(GL_PATCHES, 0 /* first */, 1 /* count */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

		/* Sync */
		gl.memoryBarrier(GL_ALL_BARRIER_BITS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");
	}
	catch (std::exception& exc)
	{
		gl.bindVertexArray(0);
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
		gl.bindTexture(GL_TEXTURE_2D, 0);

		if (0 != vao_id)
		{
			gl.deleteVertexArrays(1, &vao_id);
		}

		if (0 != fb_id)
		{
			gl.deleteFramebuffers(1, &fb_id);
		}

		throw exc;
	}

	gl.bindVertexArray(0);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
	gl.bindTexture(GL_TEXTURE_2D, 0);

	if (0 != vao_id)
	{
		gl.deleteVertexArrays(1, &vao_id);
	}

	if (0 != fb_id)
	{
		gl.deleteFramebuffers(1, &fb_id);
	}
}